

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-form.c
# Opt level: O1

void strnfcat(char *str,size_t max,size_t *end,char *fmt,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vp;
  __va_list_tag local_d8;
  undefined1 local_b8 [32];
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  if (*end < max) {
    local_d8.reg_save_area = local_b8;
    local_d8.overflow_arg_area = &vp[0].overflow_arg_area;
    local_d8.gp_offset = 0x20;
    local_d8.fp_offset = 0x30;
    local_98 = in_R8;
    local_90 = in_R9;
    sVar1 = vstrnfmt(str + *end,max - *end,fmt,&local_d8);
    *end = *end + sVar1;
  }
  return;
}

Assistant:

void strnfcat(char *str, size_t max, size_t *end, const char *fmt, ...)
{
	size_t len;

	va_list vp;

	/* Paranoia */
	if (*end >= max) return;

	/* Begin the Varargs Stuff */
	va_start(vp, fmt);

	/* Build the string */
	len = vstrnfmt(&str[*end], max - *end, fmt, vp);

	/* End the Varargs Stuff */
	va_end(vp);

	/* Change the end value */
	*end += len;
}